

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1133::run(TestCase1133 *this)

{
  char cVar1;
  char *pcVar2;
  uint i;
  long lVar3;
  Orphanage OVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  Reader RVar6;
  char *local_190;
  DebugComparison<int,_unsigned_long> _kjCondition;
  char *local_160;
  OrphanBuilder local_158;
  BuilderFor<capnp::Text> builder;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  OVar4 = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  OrphanBuilder::initText((OrphanBuilder *)&_kjCondition,OVar4.arena,OVar4.capTable,0x11);
  local_158.segment = (SegmentBuilder *)_kjCondition.right;
  local_158.capTable = (CapTableBuilder *)_kjCondition.op.content.ptr;
  local_158.location = (word *)_kjCondition.op.content.size_;
  local_158.tag.content = _kjCondition._0_8_;
  OrphanBuilder::asText(&builder,&local_158);
  memset(builder.content.ptr,0x61,builder.content.size_ - 1);
  AVar5 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  _kjCondition.right = (AVar5.ptr)->size_;
  _kjCondition.left = 4;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 4;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_190 = (char *)CONCAT44(local_190._4_4_,4);
    AVar5 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    local_160 = (char *)(AVar5.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x473,ERROR,
               "\"failed: expected \" \"(4) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 4, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (4) == (message.getSegmentsForOutput()[0].size())",
               &_kjCondition,(int *)&local_190,(unsigned_long *)&local_160);
  }
  OrphanBuilder::truncateText(&local_158,0x1b);
  AVar5 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
  _kjCondition.right = (AVar5.ptr)->size_;
  _kjCondition.left = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_190 = (char *)CONCAT44(local_190._4_4_,5);
    AVar5 = MessageBuilder::getSegmentsForOutput(&message.super_MessageBuilder);
    local_160 = (char *)(AVar5.ptr)->size_;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x475,ERROR,
               "\"failed: expected \" \"(5) == (message.getSegmentsForOutput()[0].size())\", _kjCondition, 5, message.getSegmentsForOutput()[0].size()"
               ,(char (*) [67])"failed: expected (5) == (message.getSegmentsForOutput()[0].size())",
               &_kjCondition,(int *)&local_190,(unsigned_long *)&local_160);
  }
  RVar6 = OrphanBuilder::asTextReader(&local_158);
  pcVar2 = RVar6.super_StringPtr.content.ptr;
  _kjCondition.right = RVar6.super_StringPtr.content.size_ - 1;
  _kjCondition.result = (char *)_kjCondition.right == (char *)0x1b;
  _kjCondition.left = 0x1b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_190 = (char *)CONCAT44(local_190._4_4_,0x1b);
    local_160 = (char *)_kjCondition.right;
    kj::_::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x478,ERROR,
               "\"failed: expected \" \"(27) == (reader.size())\", _kjCondition, 27, reader.size()",
               (char (*) [41])"failed: expected (27) == (reader.size())",&_kjCondition,
               (int *)&local_190,(unsigned_long *)&local_160);
  }
  _kjCondition._0_8_ = builder.content.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = builder.content.ptr == pcVar2;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_160 = builder.content.ptr;
    local_190 = pcVar2;
    _kjCondition.right = (unsigned_long)pcVar2;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char*,char_const*>&,char*,char_const*>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x479,ERROR,
               "\"failed: expected \" \"(builder.begin()) == (reader.begin())\", _kjCondition, builder.begin(), reader.begin()"
               ,(char (*) [55])"failed: expected (builder.begin()) == (reader.begin())",
               (DebugComparison<char_*,_const_char_*> *)&_kjCondition,&local_160,&local_190);
  }
  lVar3 = 0;
  do {
    cVar1 = pcVar2[lVar3];
    _kjCondition.left._1_1_ = cVar1;
    _kjCondition.left._0_1_ = 0x61;
    _kjCondition.right = (unsigned_long)anon_var_dwarf_a914;
    _kjCondition.op.content.ptr = &DAT_00000005;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar1 == 'a');
    if ((cVar1 != 'a') && (kj::_::Debug::minSeverity < 3)) {
      local_160 = (char *)CONCAT71(local_160._1_7_,0x61);
      local_190 = (char *)CONCAT71(local_190._1_7_,pcVar2[lVar3]);
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugComparison<char,char>&,char,char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x47c,ERROR,
                 "\"failed: expected \" \"(\'a\') == (reader[i])\", _kjCondition, \'a\', reader[i]",
                 (char (*) [38])"failed: expected (\'a\') == (reader[i])",
                 (DebugComparison<char,_char> *)&_kjCondition,(char *)&local_160,(char *)&local_190)
      ;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x11);
  lVar3 = 0;
  do {
    cVar1 = pcVar2[lVar3 + 0x11];
    _kjCondition._0_8_ = (ulong)CONCAT61(_kjCondition._2_6_,cVar1) << 8;
    _kjCondition.right = (unsigned_long)anon_var_dwarf_a914;
    _kjCondition.op.content.ptr = &DAT_00000005;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar1 == '\0');
    if ((cVar1 != '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_160 = (char *)((ulong)local_160 & 0xffffffffffffff00);
      local_190 = (char *)CONCAT71(local_190._1_7_,pcVar2[lVar3 + 0x11]);
      kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<char,char>&,char,char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x47f,ERROR,
                 "\"failed: expected \" \"(\'\\\\0\') == (reader[i])\", _kjCondition, \'\\0\', reader[i]"
                 ,(char (*) [39])"failed: expected (\'\\0\') == (reader[i])",
                 (DebugComparison<char,_char> *)&_kjCondition,(char *)&local_160,(char *)&local_190)
      ;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  if (local_158.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_158);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendText) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<Text>(17);
  auto builder = orphan.get();
  memset(builder.begin(), 'a', builder.size());

  EXPECT_EQ(4, message.getSegmentsForOutput()[0].size());
  orphan.truncate(27);
  EXPECT_EQ(5, message.getSegmentsForOutput()[0].size());

  auto reader = orphan.getReader();
  EXPECT_EQ(27, reader.size());
  EXPECT_EQ(builder.begin(), reader.begin());

  for (uint i = 0; i < 17; i++) {
    EXPECT_EQ('a', reader[i]);
  }
  for (uint i = 17; i < 27; i++) {
    EXPECT_EQ('\0', reader[i]);
  }
}